

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::SpectrumImageTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumImageTexture *this)

{
  MIPMap *args_2;
  
  args_2 = (this->super_ImageTextureBase).mipmap;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::TextureMapping2DHandle_const&,float_const&,bool_const&,pbrt::MIPMap&>
            (__return_storage_ptr__,
             "[ SpectrumImageTexture mapping: %s scale: %f invert: %s mipmap: %s ]",
             (TextureMapping2DHandle *)this,&(this->super_ImageTextureBase).scale,
             &(this->super_ImageTextureBase).invert,args_2);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumImageTexture::ToString() const {
    return StringPrintf(
        "[ SpectrumImageTexture mapping: %s scale: %f invert: %s mipmap: %s ]", mapping,
        scale, invert, *mipmap);
}